

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_rom_writer.cpp
# Opt level: O3

void io::write_world_to_rom(World *world,ROM *rom)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *strings;
  byte bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  pointer ppMVar6;
  pointer ppBVar7;
  Blockset *pBVar8;
  pointer ppIVar9;
  _Base_ptr p_Var10;
  EnemyType *pEVar11;
  HuffmanTree *this;
  pointer pMVar12;
  ColorPalette<13UL> *pCVar13;
  undefined8 uVar14;
  map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
  *pmVar15;
  undefined4 uVar16;
  pointer ppHVar17;
  __normal_iterator<EnemyType_**,_std::vector<EnemyType_*,_std::allocator<EnemyType_*>_>_> __last;
  undefined1 *puVar18;
  uint8_t i;
  uint8_t uVar19;
  undefined2 uVar20;
  uint16_t uVar21;
  uint32_t uVar22;
  int iVar23;
  _Rb_tree_color _Var24;
  mapped_type_conflict1 *pmVar25;
  long lVar26;
  _Base_ptr p_Var27;
  Code *pCVar28;
  _Rb_tree_node_base *p_Var29;
  mapped_type_conflict2 *pmVar30;
  ulong uVar31;
  mapped_type *pmVar32;
  byte *pbVar33;
  ColorPalette<6UL> *pCVar34;
  undefined1 auVar35 [8];
  LandstalkerException *pLVar36;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar37;
  undefined1 *puVar38;
  _Base_ptr p_Var39;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar40;
  char cVar41;
  byte bVar42;
  EntityHighPalette *palette;
  pointer puVar43;
  ColorPalette<6UL> *this_00;
  pointer pcVar44;
  MapPalette *__range2;
  __normal_iterator<EnemyType_**,_std::vector<EnemyType_*,_std::allocator<EnemyType_*>_>_> __last_00
  ;
  _Base_ptr *pp_Var45;
  undefined1 *puVar46;
  undefined1 *puVar47;
  mapped_type mVar48;
  const_iterator __begin1;
  pointer puVar49;
  pointer ppIVar50;
  __normal_iterator<EnemyType_**,_std::vector<EnemyType_*,_std::allocator<EnemyType_*>_>_> _Var51;
  long lVar52;
  pointer ppCVar53;
  mapped_type_conflict2 mVar54;
  pointer ppMVar55;
  key_type pMVar56;
  pointer pMVar57;
  pointer ppBVar58;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Dinopony[P]randstalker_extlibs_landstalker_lib_landstalker_lib_io_world_rom_writer_cpp:178:9)>
  *__comp;
  size_t sVar59;
  char cVar60;
  pointer puVar61;
  bool bVar62;
  bool bVar63;
  initializer_list<unsigned_char> __l;
  map<Blockset_*,_unsigned_int,_std::less<Blockset_*>,_std::allocator<std::pair<Blockset_*const,_unsigned_int>_>_>
  blockset_addresses;
  ByteArray bytes;
  MapLayout *layout;
  ByteArray blockset_group_bytes;
  const_iterator __end1;
  Blockset *blockset;
  ByteArray blockset_bytes;
  vector<EnemyType_*,_std::allocator<EnemyType_*>_> enemy_types;
  ByteArray high_palettes_bytes;
  set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> drop_probabilities
  ;
  map<MapLayout_*,_unsigned_int,_std::less<MapLayout_*>,_std::allocator<std::pair<MapLayout_*const,_unsigned_int>_>_>
  map_layout_addresses;
  map<EnemyType_*,_unsigned_short,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
  instances_in_game;
  map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
  drop_probability_lookup;
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  _Base_ptr local_378;
  _Base_ptr local_370;
  _Base_ptr local_368;
  _Base_ptr local_360;
  size_t local_358;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_350;
  key_type local_318;
  World *local_310;
  undefined1 local_308 [12];
  undefined4 uStack_2fc;
  undefined1 local_2f8 [16];
  _Base_ptr local_2e8;
  _Base_ptr p_Stack_2e0;
  _Base_ptr local_2d8;
  _Base_ptr p_Stack_2d0;
  size_t local_2c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  _Stack_2c0;
  undefined1 local_288 [8];
  undefined8 uStack_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278 [2];
  undefined1 local_258 [8];
  undefined8 uStack_250;
  _Base_ptr local_248;
  key_type local_220;
  undefined1 local_218 [8];
  _Base_ptr p_Stack_210;
  _Base_ptr local_208;
  undefined1 local_1e8 [8];
  pointer puStack_1e0;
  _Base_ptr local_1d8;
  undefined1 local_1b8 [8];
  pointer puStack_1b0;
  _Base_ptr local_1a8;
  _Base_ptr local_1a0;
  _Base_ptr local_198;
  _Base_ptr local_190 [2];
  _Base_ptr local_180;
  __normal_iterator<EnemyType_**,_std::vector<EnemyType_*,_std::allocator<EnemyType_*>_>_> local_178
  ;
  __normal_iterator<EnemyType_**,_std::vector<EnemyType_*,_std::allocator<EnemyType_*>_>_>
  _Stack_170;
  long local_168;
  undefined1 local_158 [8];
  void *pvStack_150;
  _Base_ptr local_148;
  _Base_ptr local_140;
  _Base_ptr local_138;
  _Base_ptr local_130;
  EnemyType **local_128;
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  local_120;
  _Rb_tree<MapLayout_*,_std::pair<MapLayout_*const,_unsigned_int>,_std::_Select1st<std::pair<MapLayout_*const,_unsigned_int>_>,_std::less<MapLayout_*>,_std::allocator<std::pair<MapLayout_*const,_unsigned_int>_>_>
  local_f0;
  _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
  local_c0;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_unsigned_char>,_std::_Select1st<std::pair<const_unsigned_short,_unsigned_char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
  local_90;
  _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
  local_60;
  
  World::clean_unused_map_palettes(world);
  World::clean_unused_blocksets(world);
  World::clean_unused_layouts(world);
  md::ROM::mark_empty_chunk(rom,0xa2392,0x11c926);
  local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f0._M_impl.super__Rb_tree_header._M_header;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppMVar55 = (world->_map_layouts).super__Vector_base<MapLayout_*,_std::allocator<MapLayout_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppMVar6 = (world->_map_layouts).super__Vector_base<MapLayout_*,_std::allocator<MapLayout_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_310 = world;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppMVar55 != ppMVar6) {
    do {
      local_288 = (undefined1  [8])*ppMVar55;
      encode_map_layout((ByteArray *)local_308,(MapLayout *)local_288);
      local_398._8_8_ = (pointer)0x0;
      local_388._0_8_ = local_388._0_8_ & 0xffffffffffffff00;
      local_398._0_8_ = local_388;
      uVar22 = md::ROM::inject_bytes
                         (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_308,
                          (string *)local_398);
      if ((undefined1 *)local_398._0_8_ != local_388) {
        operator_delete((void *)local_398._0_8_,local_388._0_8_ + 1);
      }
      pmVar25 = std::
                map<MapLayout_*,_unsigned_int,_std::less<MapLayout_*>,_std::allocator<std::pair<MapLayout_*const,_unsigned_int>_>_>
                ::operator[]((map<MapLayout_*,_unsigned_int,_std::less<MapLayout_*>,_std::allocator<std::pair<MapLayout_*const,_unsigned_int>_>_>
                              *)&local_f0,(key_type *)local_288);
      *pmVar25 = uVar22;
      if ((pointer)local_308._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_308._0_8_,local_2f8._0_8_ - local_308._0_8_);
      }
      ppMVar55 = ppMVar55 + 1;
    } while (ppMVar55 != ppMVar6);
  }
  md::ROM::mark_empty_chunk(rom,0x1af804,0x1e0000);
  local_288 = (undefined1  [8])0x0;
  uStack_280 = (ColorPalette<7UL> *)0x0;
  local_278[0]._M_allocated_capacity = (_Base_ptr)0x0;
  local_398._8_8_ = local_398._8_8_ & 0xffffffff00000000;
  local_388._0_8_ = (undefined1 *)0x0;
  local_388._8_8_ = (_Base_ptr)(local_398 + 8);
  local_378 = (_Base_ptr)(local_398 + 8);
  local_370 = (_Base_ptr)0x0;
  pMVar56 = (key_type)
            (local_310->_blockset_groups).
            super__Vector_base<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_318 = (key_type)
              (local_310->_blockset_groups).
              super__Vector_base<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar56 != local_318) {
    do {
      local_258 = (undefined1  [8])0x0;
      uStack_250 = (pointer)0x0;
      local_248 = (_Base_ptr)0x0;
      ppBVar58 = *(pointer *)pMVar56;
      local_220 = pMVar56;
      ppBVar7 = (pointer)(pMVar56->_foreground_tiles).
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start;
      for (; ppBVar58 != ppBVar7; ppBVar58 = ppBVar58 + 1) {
        local_218 = (undefined1  [8])*ppBVar58;
        if ((undefined1 *)local_388._0_8_ == (undefined1 *)0x0) {
LAB_001b7010:
          encode_blockset((ByteArray *)local_1e8,(Blockset *)local_218);
          stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
          local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
          local_308._0_8_ = local_2f8;
          uVar22 = md::ROM::inject_bytes
                             (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e8
                              ,(string *)local_308);
          pmVar25 = std::
                    map<Blockset_*,_unsigned_int,_std::less<Blockset_*>,_std::allocator<std::pair<Blockset_*const,_unsigned_int>_>_>
                    ::operator[]((map<Blockset_*,_unsigned_int,_std::less<Blockset_*>,_std::allocator<std::pair<Blockset_*const,_unsigned_int>_>_>
                                  *)local_398,(key_type *)local_218);
          *pmVar25 = uVar22;
          if ((undefined1 *)local_308._0_8_ != local_2f8) {
            operator_delete((void *)local_308._0_8_,(ulong)(local_2f8._0_8_ + 1));
          }
          if (local_1e8 != (undefined1  [8])0x0) {
            operator_delete((void *)local_1e8,(long)local_1d8 - (long)local_1e8);
          }
        }
        else {
          puVar18 = (undefined1 *)local_388._0_8_;
          puVar47 = local_398 + 8;
          do {
            puVar46 = puVar47;
            puVar38 = puVar18;
            pBVar8 = *(Blockset **)(puVar38 + 0x20);
            puVar47 = puVar38;
            if (pBVar8 < (ulong)local_218) {
              puVar47 = puVar46;
            }
            puVar18 = *(undefined1 **)(puVar38 + ((ulong)(pBVar8 < (ulong)local_218) + 2) * 8);
          } while (*(undefined1 **)(puVar38 + ((ulong)(pBVar8 < (ulong)local_218) + 2) * 8) !=
                   (undefined1 *)0x0);
          if (puVar47 == local_398 + 8) goto LAB_001b7010;
          if (pBVar8 < (ulong)local_218) {
            puVar38 = puVar46;
          }
          if ((ulong)local_218 < *(Blockset **)(puVar38 + 0x20)) goto LAB_001b7010;
        }
        pmVar25 = std::
                  map<Blockset_*,_unsigned_int,_std::less<Blockset_*>,_std::allocator<std::pair<Blockset_*const,_unsigned_int>_>_>
                  ::operator[]((map<Blockset_*,_unsigned_int,_std::less<Blockset_*>,_std::allocator<std::pair<Blockset_*const,_unsigned_int>_>_>
                                *)local_398,(key_type *)local_218);
        ByteArray::add_long((ByteArray *)local_258,*pmVar25);
      }
      stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
      local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
      local_308._0_8_ = local_2f8;
      uVar22 = md::ROM::inject_bytes
                         (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_258,
                          (string *)local_308);
      pMVar56 = local_220;
      if ((undefined1 *)local_308._0_8_ != local_2f8) {
        operator_delete((void *)local_308._0_8_,(ulong)(local_2f8._0_8_ + 1));
      }
      ByteArray::add_long((ByteArray *)local_288,uVar22);
      if (local_258 != (undefined1  [8])0x0) {
        operator_delete((void *)local_258,(long)local_248 - (long)local_258);
      }
      pMVar56 = (key_type)
                &(pMVar56->_foreground_tiles).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    } while (pMVar56 != local_318);
  }
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  local_308._0_8_ = local_2f8;
  uVar22 = md::ROM::inject_bytes
                     (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_288,
                      (string *)local_308);
  if ((undefined1 *)local_308._0_8_ != local_2f8) {
    operator_delete((void *)local_308._0_8_,(ulong)(local_2f8._0_8_ + 1));
  }
  md::ROM::set_long(rom,0x1af800,uVar22);
  std::
  _Rb_tree<Blockset_*,_std::pair<Blockset_*const,_unsigned_int>,_std::_Select1st<std::pair<Blockset_*const,_unsigned_int>_>,_std::less<Blockset_*>,_std::allocator<std::pair<Blockset_*const,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<Blockset_*,_std::pair<Blockset_*const,_unsigned_int>,_std::_Select1st<std::pair<Blockset_*const,_unsigned_int>_>,_std::less<Blockset_*>,_std::allocator<std::pair<Blockset_*const,_unsigned_int>_>_>
               *)local_398);
  if (local_288 != (undefined1  [8])0x0) {
    operator_delete((void *)local_288,local_278[0]._M_allocated_capacity - (long)local_288);
  }
  md::ROM::mark_empty_chunk(rom,0x29732,0x29a0a);
  local_1e8 = (undefined1  [8])0x0;
  puStack_1e0 = (pointer)0x0;
  local_1d8 = (_Base_ptr)0x0;
  p_Var27 = (local_310->_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_318 = (key_type)&(local_310->_items)._M_t._M_impl.super__Rb_tree_header;
  if ((key_type)p_Var27 != local_318) {
    do {
      local_218 = (undefined1  [8])0x0;
      p_Stack_210 = (_Base_ptr)0x0;
      local_208 = (_Base_ptr)0x0;
      local_388._0_2_ = 0x20;
      local_398._8_8_ = (pointer)0x1;
      local_398._0_8_ = local_388;
      stringtools::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_288,(string *)&(p_Var27[1]._M_parent)->_M_left,(string *)local_398
                        );
      local_180 = p_Var27;
      if ((undefined1 *)local_398._0_8_ != local_388) {
        operator_delete((void *)local_398._0_8_,(ulong)(local_388._0_8_ + 1));
      }
      local_220 = (key_type)uStack_280;
      if (local_288 != (undefined1  [8])uStack_280) {
        puVar49 = (pointer)0x0;
        auVar35 = local_288;
        do {
          local_398._0_8_ = local_388;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_398,*(long *)auVar35,
                     (long)(((key_type)auVar35)->_foreground_tiles).
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start + *(long *)auVar35);
          cVar60 = (char)puVar49;
          if ((byte)(cVar60 - 7U) < 2) {
            local_308[0] = 0x6a;
            std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_218,local_308);
            cVar60 = '\0';
          }
          cVar41 = cVar60 + '\x01';
          if (cVar60 == '\0') {
            cVar41 = '\0';
          }
          bVar42 = cVar41 + (char)local_398._8_8_;
          if (bVar42 < 9) {
            if (cVar60 != '\0') {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_308," ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_398);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_398,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_308);
              if ((undefined1 *)local_308._0_8_ != local_2f8) {
                operator_delete((void *)local_308._0_8_,(ulong)(local_2f8._0_8_ + 1));
              }
            }
            local_308._0_8_ = (pointer)0x0;
            stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
            local_2f8._0_8_ = (pointer)0x0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_308,
                       local_398._8_8_);
            if ((pointer)local_398._8_8_ != (pointer)0x0) {
              puVar61 = (pointer)(local_398._8_8_ + local_398._0_8_);
              puVar49 = (pointer)local_398._0_8_;
              do {
                lVar26 = 0;
                do {
                  if ((&Symbols::TABLE)[lVar26] == *puVar49) {
                    local_258[0] = (char)lVar26;
                    std::vector<unsigned_char,std::allocator<unsigned_char>>::
                    emplace_back<unsigned_char&>
                              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_308,
                               (uchar *)local_258);
                    break;
                  }
                  lVar26 = lVar26 + 1;
                } while (lVar26 != 0x6c);
                puVar49 = puVar49 + 1;
              } while (puVar49 != puVar61);
            }
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_218,p_Stack_210,
                       local_308._0_8_,stack0xfffffffffffffd00);
            if ((pointer)local_308._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_308._0_8_,local_2f8._0_8_ - local_308._0_8_);
            }
            puVar49 = (pointer)(ulong)bVar42;
          }
          else if ((ulong)local_398._8_8_ < (pointer)0x9) {
            local_308[0] = 0x6a;
            std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_218,
                       (uchar *)local_308);
            puVar49 = (pointer)local_398._8_8_;
            local_308._0_8_ = (pointer)0x0;
            stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
            local_2f8._0_8_ = (pointer)0x0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_308,
                       local_398._8_8_);
            if ((pointer)local_398._8_8_ != (pointer)0x0) {
              puVar43 = (pointer)(local_398._8_8_ + local_398._0_8_);
              puVar61 = (pointer)local_398._0_8_;
              do {
                lVar26 = 0;
                do {
                  if ((&Symbols::TABLE)[lVar26] == *puVar61) {
                    local_258[0] = (char)lVar26;
                    std::vector<unsigned_char,std::allocator<unsigned_char>>::
                    emplace_back<unsigned_char&>
                              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_308,
                               (uchar *)local_258);
                    break;
                  }
                  lVar26 = lVar26 + 1;
                } while (lVar26 != 0x6c);
                puVar61 = puVar61 + 1;
              } while (puVar61 != puVar43);
            }
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_218,p_Stack_210,
                       local_308._0_8_,stack0xfffffffffffffd00);
            if ((pointer)local_308._0_8_ != (pointer)0x0) {
              puVar61 = (pointer)(local_2f8._0_8_ - local_308._0_8_);
LAB_001b76f2:
              operator_delete((void *)local_308._0_8_,(ulong)puVar61);
            }
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_308,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_398,0,(ulong)(byte)(7 - cVar60));
            local_258 = (undefined1  [8])0x0;
            uStack_250 = (pointer)0x0;
            local_248 = (_Base_ptr)0x0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_258,
                       (size_type)stack0xfffffffffffffd00);
            if (stack0xfffffffffffffd00 != (ColorPalette<6UL> *)0x0) {
              puVar61 = (pointer)((long)stack0xfffffffffffffd00 + local_308._0_8_);
              puVar49 = (pointer)local_308._0_8_;
              do {
                lVar26 = 0;
                do {
                  if ((&Symbols::TABLE)[lVar26] == *puVar49) {
                    local_1b8[0] = (char)lVar26;
                    std::vector<unsigned_char,std::allocator<unsigned_char>>::
                    emplace_back<unsigned_char&>
                              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_258,
                               local_1b8);
                    break;
                  }
                  lVar26 = lVar26 + 1;
                } while (lVar26 != 0x6c);
                puVar49 = puVar49 + 1;
              } while (puVar49 != puVar61);
            }
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_218,p_Stack_210,
                       local_258,uStack_250);
            if (local_258 != (undefined1  [8])0x0) {
              operator_delete((void *)local_258,(long)local_248 - (long)local_258);
            }
            if ((undefined1 *)local_308._0_8_ != local_2f8) {
              operator_delete((void *)local_308._0_8_,(ulong)(local_2f8._0_8_ + 1));
            }
            local_308[0] = 0x69;
            std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_218,
                       (uchar *)local_308);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_308,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_398,(ulong)(byte)(7 - cVar60),0xffffffffffffffff);
            local_258 = (undefined1  [8])0x0;
            uStack_250 = (pointer)0x0;
            local_248 = (_Base_ptr)0x0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_258,
                       (size_type)stack0xfffffffffffffd00);
            if (stack0xfffffffffffffd00 != (ColorPalette<6UL> *)0x0) {
              puVar61 = (pointer)((long)stack0xfffffffffffffd00 + local_308._0_8_);
              puVar49 = (pointer)local_308._0_8_;
              do {
                lVar26 = 0;
                do {
                  if ((&Symbols::TABLE)[lVar26] == *puVar49) {
                    local_1b8[0] = (char)lVar26;
                    std::vector<unsigned_char,std::allocator<unsigned_char>>::
                    emplace_back<unsigned_char&>
                              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_258,
                               local_1b8);
                    break;
                  }
                  lVar26 = lVar26 + 1;
                } while (lVar26 != 0x6c);
                puVar49 = puVar49 + 1;
              } while (puVar49 != puVar61);
            }
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_218,p_Stack_210,
                       local_258,uStack_250);
            if (local_258 != (undefined1  [8])0x0) {
              operator_delete((void *)local_258,(long)local_248 - (long)local_258);
            }
            puVar49 = (pointer)((ulong)stack0xfffffffffffffd00 & 0xff);
            if ((undefined1 *)local_308._0_8_ != local_2f8) {
              puVar61 = (pointer)(local_2f8._0_8_ + 1);
              goto LAB_001b76f2;
            }
          }
          if ((undefined1 *)local_398._0_8_ != local_388) {
            operator_delete((void *)local_398._0_8_,(ulong)(local_388._0_8_ + 1));
          }
          auVar35 = (undefined1  [8])&((key_type)auVar35)->_background_tiles;
        } while (auVar35 != (undefined1  [8])local_220);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_288);
      local_398[0] = (string)((char)p_Stack_210 - local_218[0]);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_1e8,local_398);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_1e8,puStack_1e0,
                 local_218,p_Stack_210);
      p_Var27 = local_180;
      if (local_218 != (undefined1  [8])0x0) {
        operator_delete((void *)local_218,(long)local_208 - (long)local_218);
      }
      p_Var27 = (_Base_ptr)std::_Rb_tree_increment(p_Var27);
    } while ((key_type)p_Var27 != local_318);
  }
  local_398._8_8_ = (pointer)0x0;
  local_388._0_8_ = local_388._0_8_ & 0xffffffffffffff00;
  local_398._0_8_ = local_388;
  uVar22 = md::ROM::inject_bytes
                     (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e8,
                      (string *)local_398);
  if ((undefined1 *)local_398._0_8_ != local_388) {
    operator_delete((void *)local_398._0_8_,local_388._0_8_ + 1);
  }
  local_388._0_8_ = 0;
  local_398._0_8_ = (pointer)0x0;
  local_398._8_8_ = (pointer)0x0;
  local_378 = (_Base_ptr)((ulong)local_378 & 0xffffffff00000000);
  local_370 = (_Base_ptr)0x0;
  local_358 = 0;
  local_350._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_350._M_impl.super__Rb_tree_header._M_header;
  local_350._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_350._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_350._M_impl.super__Rb_tree_header._M_node_count = 0;
  uStack_280 = (ColorPalette<7UL> *)CONCAT71(uStack_280._1_7_,2);
  local_288 = (undefined1  [8])&PTR_getXn_00262c50;
  local_308._0_8_ = &PTR_getXn_00262cd8;
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)CONCAT44(2,uVar22);
  local_368 = (_Base_ptr)&local_378;
  local_360 = (_Base_ptr)&local_378;
  local_350._M_impl.super__Rb_tree_header._M_header._M_right =
       local_350._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::lea((Code *)local_398,(Param *)local_308,(AddressRegister *)local_288);
  local_308._0_8_ = &PTR_getXn_00262cd8;
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x2000294b0;
  md::Code::jmp((Code *)local_398,(Param *)local_308);
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  local_308._0_8_ = local_2f8;
  uVar22 = md::ROM::inject_code(rom,(Code *)local_398,(string *)local_308);
  if ((undefined1 *)local_308._0_8_ != local_2f8) {
    operator_delete((void *)local_308._0_8_,(ulong)(local_2f8._0_8_ + 1));
  }
  local_2c8 = 0;
  _Stack_2c0._M_impl._0_8_ = 0;
  local_2e8 = (_Base_ptr)0x0;
  p_Stack_2e0 = (_Base_ptr)0x0;
  local_2f8._0_8_ = (pointer)0x0;
  local_2f8._8_8_ = 0;
  local_308._0_8_ = (pointer)0x0;
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_2c0._M_impl.super__Rb_tree_header._M_header;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_288 = (undefined1  [8])&PTR_getXn_00262cd8;
  uStack_280 = (ColorPalette<7UL> *)CONCAT44(2,uVar22);
  local_2d8 = (_Base_ptr)&local_2e8;
  p_Stack_2d0 = (_Base_ptr)&local_2e8;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_left;
  pCVar28 = md::Code::jmp((Code *)local_308,(Param *)local_288);
  md::ROM::set_code(rom,0x294a2,pCVar28);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&_Stack_2c0);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_2f8 + 8));
  if ((pointer)local_308._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_308._0_8_,local_2f8._0_8_ - local_308._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_350);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_388 + 8));
  if ((pointer)local_398._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_398._0_8_,local_388._0_8_ - local_398._0_8_);
  }
  if (local_1e8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1e8,(long)local_1d8 - (long)local_1e8);
  }
  local_288 = (undefined1  [8])0x0;
  uStack_280 = (ColorPalette<7UL> *)0x0;
  local_278[0]._M_allocated_capacity = (_Base_ptr)0x0;
  p_Var27 = (local_310->_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((key_type)p_Var27 != local_318) {
    do {
      local_398[0] = (string)(*(char *)((long)&p_Var27[1]._M_parent[1]._M_left + 4) * '\x10' +
                             *(char *)&p_Var27[1]._M_parent[1]._M_left);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_288,local_398);
      local_398[0] = (string)0xff;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_288,local_398);
      uVar20 = *(undefined2 *)((long)&p_Var27[1]._M_parent[1]._M_left + 2);
      local_398[0] = SUB21((ushort)uVar20 >> 8,0);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_288,local_398);
      local_398[0] = (string)(char)uVar20;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_288,local_398);
      p_Var27 = (_Base_ptr)std::_Rb_tree_increment(p_Var27);
    } while ((key_type)p_Var27 != local_318);
  }
  local_398._8_8_ = (pointer)0x0;
  local_388._0_8_ = local_388._0_8_ & 0xffffffffffffff00;
  local_398._0_8_ = local_388;
  uVar22 = md::ROM::inject_bytes
                     (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_288,
                      (string *)local_398);
  if ((undefined1 *)local_398._0_8_ != local_388) {
    operator_delete((void *)local_398._0_8_,local_388._0_8_ + 1);
  }
  local_388._0_8_ = 0;
  local_398._0_8_ = (pointer)0x0;
  local_398._8_8_ = (pointer)0x0;
  local_378 = (_Base_ptr)((ulong)local_378 & 0xffffffff00000000);
  local_370 = (_Base_ptr)0x0;
  local_358 = 0;
  local_350._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_350._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_350._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_350._M_impl.super__Rb_tree_header._M_header;
  local_350._M_impl.super__Rb_tree_header._M_node_count = 0;
  uStack_250 = (pointer)((ulong)uStack_250 & 0xffffffffffffff00);
  local_258 = (undefined1  [8])&PTR_getXn_00262c50;
  local_308._0_8_ = &PTR_getXn_00262cd8;
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)CONCAT44(2,uVar22);
  local_368 = (_Base_ptr)&local_378;
  local_360 = (_Base_ptr)&local_378;
  local_350._M_impl.super__Rb_tree_header._M_header._M_right =
       local_350._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::lea((Code *)local_398,(Param *)local_308,(AddressRegister *)local_258);
  uStack_250 = (pointer)((ulong)uStack_250 & 0xffffffffffffff00);
  local_258 = (undefined1  [8])&PTR_getXn_00262c50;
  puStack_1e0 = (pointer)((ulong)puStack_1e0 & 0xffffffffffffff00);
  local_1e8 = (undefined1  [8])&PTR_getXn_00262be0;
  local_308._0_8_ = &PTR_getXn_00262d58;
  local_2f8._0_8_ = local_1e8;
  local_2f8._8_5_ = 1;
  p_Stack_210 = (_Base_ptr)((ulong)p_Stack_210 & 0xffffffffffffff00);
  local_218 = (undefined1  [8])&PTR_getXn_00262c50;
  unique0x1000425f = (ColorPalette<6UL> *)local_258;
  md::Code::lea((Code *)local_398,(Param *)local_308,(AddressRegister *)local_218);
  md::Code::add_word((Code *)local_398,0x201f);
  md::Code::rts((Code *)local_398);
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  local_308._0_8_ = local_2f8;
  uVar22 = md::ROM::inject_code(rom,(Code *)local_398,(string *)local_308);
  if ((undefined1 *)local_308._0_8_ != local_2f8) {
    operator_delete((void *)local_308._0_8_,(ulong)(local_2f8._0_8_ + 1));
  }
  local_2c8 = 0;
  _Stack_2c0._M_impl._0_8_ = 0;
  local_2e8 = (_Base_ptr)0x0;
  p_Stack_2e0 = (_Base_ptr)0x0;
  local_2f8._0_8_ = (pointer)0x0;
  local_2f8._8_8_ = 0;
  local_308._0_8_ = (pointer)0x0;
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_2c0._M_impl.super__Rb_tree_header._M_header;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_258 = (undefined1  [8])&PTR_getXn_00262cd8;
  uStack_250 = (pointer)CONCAT44(2,uVar22);
  local_2d8 = (_Base_ptr)&local_2e8;
  p_Stack_2d0 = (_Base_ptr)&local_2e8;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_left;
  pCVar28 = md::Code::jmp((Code *)local_308,(Param *)local_258);
  md::ROM::set_code(rom,0x292fc,pCVar28);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&_Stack_2c0);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_2f8 + 8));
  if ((pointer)local_308._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_308._0_8_,local_2f8._0_8_ - local_308._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_350);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_388 + 8));
  if ((pointer)local_398._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_398._0_8_,local_388._0_8_ - local_398._0_8_);
  }
  if (local_288 != (undefined1  [8])0x0) {
    operator_delete((void *)local_288,local_278[0]._M_allocated_capacity - (long)local_288);
  }
  if (0x800 < (ulong)((long)(local_310->_chest_contents).
                            super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(local_310->_chest_contents).
                           super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                           super__Vector_impl_data._M_start)) {
    pLVar36 = (LandstalkerException *)__cxa_allocate_exception(0x28);
    local_398._0_8_ = local_388;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_398,"Cannot declare more than 256 chests","");
    LandstalkerException::LandstalkerException(pLVar36,(string *)local_398);
    __cxa_throw(pLVar36,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException)
    ;
  }
  md::ROM::mark_empty_chunk(rom,0x9eabe,0x9eb9c);
  local_288 = (undefined1  [8])0x0;
  uStack_280 = (ColorPalette<7UL> *)0x0;
  local_278[0]._M_allocated_capacity = (_Base_ptr)0x0;
  ppIVar50 = (local_310->_chest_contents).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppIVar9 = (local_310->_chest_contents).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  if (ppIVar50 != ppIVar9) {
    do {
      if (*ppIVar50 == (Item *)0x0) {
        uVar19 = '?';
      }
      else {
        uVar19 = (*ppIVar50)->_id;
      }
      local_398[0] = (string)uVar19;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_288,local_398);
      ppIVar50 = ppIVar50 + 1;
    } while (ppIVar50 != ppIVar9);
  }
  local_398._8_8_ = (pointer)0x0;
  local_388._0_8_ = local_388._0_8_ & 0xffffffffffffff00;
  local_398._0_8_ = local_388;
  uVar22 = md::ROM::inject_bytes
                     (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_288,
                      (string *)local_398);
  if ((undefined1 *)local_398._0_8_ != local_388) {
    operator_delete((void *)local_398._0_8_,local_388._0_8_ + 1);
  }
  local_388._0_8_ = 0;
  local_398._0_8_ = (_Base_ptr)0x0;
  local_398._8_8_ = (pointer)0x0;
  local_378 = (_Base_ptr)((ulong)local_378 & 0xffffffff00000000);
  local_370 = (_Base_ptr)0x0;
  local_358 = 0;
  local_350._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_350._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_350._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_350._M_impl.super__Rb_tree_header._M_header;
  local_350._M_impl.super__Rb_tree_header._M_node_count = 0;
  uStack_250 = (pointer)((ulong)uStack_250 & 0xffffffffffffff00);
  local_258 = (undefined1  [8])&PTR_getXn_00262c50;
  local_308._0_8_ = &PTR_getXn_00262cd8;
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)CONCAT44(2,uVar22);
  local_368 = (_Base_ptr)&local_378;
  local_360 = (_Base_ptr)&local_378;
  local_350._M_impl.super__Rb_tree_header._M_header._M_right =
       local_350._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::lea((Code *)local_398,(Param *)local_308,(AddressRegister *)local_258);
  uStack_250 = (pointer)((ulong)uStack_250 & 0xffffffffffffff00);
  local_258 = (undefined1  [8])&PTR_getXn_00262c50;
  puStack_1e0 = (pointer)CONCAT71(puStack_1e0._1_7_,1);
  local_1e8 = (undefined1  [8])&PTR_getXn_00262be0;
  local_308._0_8_ = &PTR_getXn_00262d58;
  local_2f8._0_8_ = local_1e8;
  local_2f8._8_5_ = 1;
  p_Stack_210 = (_Base_ptr)((ulong)p_Stack_210 & 0xffffffffffffff00);
  local_218 = (undefined1  [8])&PTR_getXn_00262be0;
  unique0x10004267 = (ColorPalette<6UL> *)local_258;
  md::Code::move((Code *)local_398,(Param *)local_308,(Param *)local_218,BYTE);
  md::Code::rts((Code *)local_398);
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  local_308._0_8_ = local_2f8;
  uVar22 = md::ROM::inject_code(rom,(Code *)local_398,(string *)local_308);
  if ((undefined1 *)local_308._0_8_ != local_2f8) {
    operator_delete((void *)local_308._0_8_,(ulong)(local_2f8._0_8_ + 1));
  }
  local_2c8 = 0;
  _Stack_2c0._M_impl._0_8_ = 0;
  local_2e8 = (_Base_ptr)0x0;
  p_Stack_2e0 = (_Base_ptr)0x0;
  local_2f8._0_8_ = (pointer)0x0;
  local_2f8._8_8_ = (undefined1 *)0x0;
  local_308._0_8_ = (pointer)0x0;
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_2c0._M_impl.super__Rb_tree_header._M_header;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_258 = (undefined1  [8])&PTR_getXn_00262cd8;
  uStack_250 = (pointer)CONCAT44(2,uVar22);
  local_2d8 = (_Base_ptr)&local_2e8;
  p_Stack_2d0 = (_Base_ptr)&local_2e8;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_left;
  pCVar28 = md::Code::jsr((Code *)local_308,(Param *)local_258);
  md::ROM::set_code(rom,0x9e776,pCVar28);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&_Stack_2c0);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_2f8 + 8));
  if ((pointer)local_308._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_308._0_8_,local_2f8._0_8_ - local_308._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_350);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_388 + 8));
  if ((_Base_ptr)local_398._0_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_398._0_8_,local_388._0_8_ - local_398._0_8_);
  }
  if (local_288 != (undefined1  [8])0x0) {
    operator_delete((void *)local_288,local_278[0]._M_allocated_capacity - (long)local_288);
  }
  local_168 = 0;
  local_178._M_current = (EnemyType **)0x0;
  _Stack_170._M_current = (EnemyType **)0x0;
  local_120._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120._M_impl.super__Rb_tree_header._M_header;
  local_120._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var27 = (local_310->_entity_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_220 = (key_type)&(local_310->_entity_types)._M_t._M_impl.super__Rb_tree_header;
  local_120._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((key_type)p_Var27 != local_220) {
    pmVar15 = &local_310->_maps;
    do {
      (*(code *)**(undefined8 **)p_Var27[1]._M_parent)
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398);
      iVar23 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_398,"enemy");
      if ((_Base_ptr)local_398._0_8_ != (_Base_ptr)local_388) {
        operator_delete((void *)local_398._0_8_,local_388._0_8_ + 1);
      }
      if (iVar23 == 0) {
        local_398._0_8_ = p_Var27[1]._M_parent;
        std::vector<EnemyType*,std::allocator<EnemyType*>>::emplace_back<EnemyType*&>
                  ((vector<EnemyType*,std::allocator<EnemyType*>> *)&local_178,
                   (EnemyType **)local_398);
        uVar20 = 1;
        if (*(char *)(local_398._0_8_ + 0x72) == '\0') {
          uVar20 = *(undefined2 *)(local_398._0_8_ + 0x70);
        }
        local_308._0_2_ = uVar20;
        std::
        _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
        ::_M_insert_unique<unsigned_short>(&local_120,(unsigned_short *)local_308);
        mVar54 = 0;
        for (p_Var29 = (local_310->_maps)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var29 != &(pmVar15->_M_t)._M_impl.super__Rb_tree_header;
            p_Var29 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var29)) {
          p_Var39 = p_Var29[1]._M_parent[1]._M_left;
          p_Var10 = p_Var29[1]._M_parent[1]._M_right;
          if (p_Var39 != p_Var10) {
            do {
              mVar54 = mVar54 + (**(char **)p_Var39 == *(char *)&(p_Var27[1]._M_parent)->_M_parent);
              p_Var39 = (_Base_ptr)&p_Var39->_M_parent;
            } while (p_Var39 != p_Var10);
          }
        }
        pmVar30 = std::
                  map<EnemyType_*,_unsigned_short,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                  ::operator[]((map<EnemyType_*,_unsigned_short,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                                *)&local_c0,(key_type *)local_398);
        *pmVar30 = mVar54;
      }
      p_Var27 = (_Base_ptr)std::_Rb_tree_increment(p_Var27);
    } while ((key_type)p_Var27 != local_220);
  }
  __last._M_current = _Stack_170._M_current;
  _Var51._M_current = local_178._M_current;
  std::
  _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
  ::_Rb_tree(&local_60,&local_c0);
  std::
  _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
  ::_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
              *)local_158,&local_60);
  p_Var27 = local_130;
  local_1a8 = local_148;
  local_388._8_8_ = local_398 + 8;
  if (local_148 == (_Base_ptr)0x0) {
    pvStack_150._0_4_ = _S_red;
    local_370 = (_Base_ptr)0x0;
    local_1a0 = (_Base_ptr)&puStack_1b0;
    pp_Var45 = local_190;
    local_198 = local_1a0;
  }
  else {
    pp_Var45 = &local_370;
    local_370 = local_130;
    local_148 = (_Base_ptr)0x0;
    local_130 = (_Base_ptr)0x0;
    local_1a8->_M_parent = (_Base_ptr)&puStack_1b0;
    local_190[0] = p_Var27;
    local_1a0 = local_140;
    local_198 = local_138;
    local_140 = (_Base_ptr)&pvStack_150;
    local_138 = (_Base_ptr)&pvStack_150;
  }
  local_388._0_8_ = (pointer)0x0;
  local_398._8_4_ = (_Rb_tree_color)pvStack_150;
  *pp_Var45 = (_Base_ptr)0x0;
  puStack_1b0 = (pointer)CONCAT44(puStack_1b0._4_4_,(_Rb_tree_color)pvStack_150);
  local_378 = (_Base_ptr)local_388._8_8_;
  std::
  _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
  ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
               *)local_398);
  if (_Var51._M_current != __last._M_current) {
    std::
    _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
    ::_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                *)local_1e8,
               (_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                *)local_1b8);
    uVar31 = (long)__last._M_current - (long)_Var51._M_current >> 3;
    lVar26 = 0x3f;
    if (uVar31 != 0) {
      for (; uVar31 >> lVar26 == 0; lVar26 = lVar26 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<EnemyType**,std::vector<EnemyType*,std::allocator<EnemyType*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<write_entity_types(World_const&,md::ROM&)::__0>>
              (_Var51,__last,(ulong)(((uint)lVar26 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Dinopony[P]randstalker_extlibs_landstalker_lib_landstalker_lib_io_world_rom_writer_cpp:178:9)>
                *)local_1e8);
    std::
    _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
    ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                 *)local_1e8);
    local_318 = (key_type)local_218;
    std::
    _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
    ::_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                *)local_318,
               (_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                *)local_1b8);
    if ((long)__last._M_current - (long)_Var51._M_current < 0x81) {
      __comp = (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Dinopony[P]randstalker_extlibs_landstalker_lib_landstalker_lib_io_world_rom_writer_cpp:178:9)>
                *)local_398;
      std::
      _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
      ::_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                  *)__comp,
                 (_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                  *)local_218);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<EnemyType**,std::vector<EnemyType*,std::allocator<EnemyType*>>>,__gnu_cxx::__ops::_Iter_comp_iter<write_entity_types(World_const&,md::ROM&)::__0>>
                (_Var51,__last,__comp);
    }
    else {
      std::
      _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
      ::_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                  *)local_288,
                 (_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                  *)local_218);
      __last_00._M_current = _Var51._M_current + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<EnemyType**,std::vector<EnemyType*,std::allocator<EnemyType*>>>,__gnu_cxx::__ops::_Iter_comp_iter<write_entity_types(World_const&,md::ROM&)::__0>>
                (_Var51,__last_00,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Dinopony[P]randstalker_extlibs_landstalker_lib_landstalker_lib_io_world_rom_writer_cpp:178:9)>
                  *)local_288);
      std::
      _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
      ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                   *)local_288);
      std::
      _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
      ::_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                  *)local_258,
                 (_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                  *)local_218);
      if (__last_00._M_current != __last._M_current) {
        do {
          std::
          _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
          ::_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                      *)local_308,
                     (_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                      *)local_258);
          if ((pointer)local_2f8._0_8_ == (pointer)0x0) {
            local_388._0_8_ = (pointer)0x0;
            _Var24 = _S_red;
            local_388._8_8_ = local_398 + 8;
            pp_Var45 = &local_370;
            local_378 = (_Base_ptr)local_388._8_8_;
          }
          else {
            local_388._0_8_ = local_2f8._0_8_;
            *(undefined1 **)(local_2f8._0_8_ + 8) = local_398 + 8;
            local_370 = p_Stack_2e0;
            local_2f8._0_8_ = (pointer)0x0;
            pp_Var45 = &p_Stack_2e0;
            local_388._8_8_ = local_2f8._8_8_;
            local_378 = local_2e8;
            _Var24 = local_308._8_4_;
            local_2f8._8_8_ = (_Base_ptr)(local_308 + 8);
            local_2e8 = (_Base_ptr)(local_308 + 8);
          }
          *pp_Var45 = (_Base_ptr)0x0;
          local_398._8_4_ = _Var24;
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<EnemyType**,std::vector<EnemyType*,std::allocator<EnemyType*>>>,__gnu_cxx::__ops::_Val_comp_iter<write_entity_types(World_const&,md::ROM&)::__0>>
                    (__last_00,
                     (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Dinopony[P]randstalker_extlibs_landstalker_lib_landstalker_lib_io_world_rom_writer_cpp:178:9)>
                      *)local_398);
          std::
          _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
          ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                       *)local_398);
          std::
          _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
          ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                       *)local_308);
          __last_00._M_current = __last_00._M_current + 1;
        } while (__last_00._M_current != __last._M_current);
      }
      __comp = (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Dinopony[P]randstalker_extlibs_landstalker_lib_landstalker_lib_io_world_rom_writer_cpp:178:9)>
                *)local_258;
    }
    std::
    _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
    ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                 *)__comp);
    std::
    _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
    ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                 *)local_218);
  }
  std::
  _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
  ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
               *)local_1b8);
  std::
  _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
  ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
               *)local_158);
  std::
  _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
  ::~_Rb_tree(&local_60);
  if (8 < local_120._M_impl.super__Rb_tree_header._M_node_count) {
    pLVar36 = (LandstalkerException *)__cxa_allocate_exception(0x28);
    local_398._0_8_ = local_388;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_398,"Having more than 8 different loot probabilities is not allowed",
               "");
    LandstalkerException::LandstalkerException(pLVar36,(string *)local_398);
    __cxa_throw(pLVar36,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException)
    ;
  }
  if ((_Rb_tree_header *)local_120._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_120._M_impl.super__Rb_tree_header) {
    uVar22 = 0x199d6;
    mVar48 = '\0';
    p_Var27 = local_120._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_398._0_2_ = (short)p_Var27[1]._M_color;
      pmVar32 = std::
                map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
                ::operator[]((map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
                              *)&local_90,(key_type *)local_398);
      *pmVar32 = mVar48;
      md::ROM::set_word(rom,uVar22,local_398._0_2_);
      uVar22 = uVar22 + 2;
      p_Var27 = (_Base_ptr)std::_Rb_tree_increment(p_Var27);
      mVar48 = mVar48 + '\x01';
    } while ((_Rb_tree_header *)p_Var27 != &local_120._M_impl.super__Rb_tree_header);
  }
  local_128 = _Stack_170._M_current;
  if (local_178._M_current == _Stack_170._M_current) {
    uVar22 = 0x1b6f0;
  }
  else {
    p_Var27 = (_Base_ptr)0x1b6f0;
    _Var51._M_current = local_178._M_current;
    do {
      pEVar11 = *_Var51._M_current;
      bVar42 = 0x3f;
      if (pEVar11->_unkillable == false) {
        bVar42 = pEVar11->_dropped_item->_id & 0x3f;
      }
      local_180 = (_Base_ptr)CONCAT71(local_180._1_7_,bVar42);
      uVar21 = 1;
      if (pEVar11->_unkillable == false) {
        uVar21 = pEVar11->_drop_probability;
      }
      bVar42 = (pEVar11->super_EntityType).field_0x65;
      local_398._0_2_ = uVar21;
      pbVar33 = std::
                map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
                ::at((map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
                      *)&local_90,(key_type *)local_398);
      bVar1 = *pbVar33;
      local_318 = (key_type)p_Var27;
      md::ROM::set_byte(rom,(uint32_t)p_Var27,(pEVar11->super_EntityType)._id);
      iVar23 = (int)local_318;
      md::ROM::set_byte(rom,iVar23 + 1,(pEVar11->super_EntityType).field_0x64);
      md::ROM::set_byte(rom,iVar23 + 2,(pEVar11->super_EntityType).field_0x66);
      uVar19 = (pEVar11->super_EntityType).field_0x67;
      if (pEVar11->_unkillable != false) {
        uVar19 = '\0';
      }
      md::ROM::set_byte(rom,iVar23 + 3,uVar19);
      md::ROM::set_byte(rom,iVar23 + 4,(bVar1 & 4) << 5 | bVar42 & 0x7f);
      md::ROM::set_byte(rom,iVar23 + 5,bVar1 * '@' + (char)local_180);
      _Var51._M_current = _Var51._M_current + 1;
      p_Var27 = (_Base_ptr)(ulong)(iVar23 + 6);
    } while (_Var51._M_current != local_128);
    uVar22 = (int)local_318 + 6;
  }
  md::ROM::set_word(rom,uVar22,0xffff);
  if (uVar22 - 0x1b931 < 0xfffe46cd) {
    pLVar36 = (LandstalkerException *)__cxa_allocate_exception(0x28);
    local_398._0_8_ = local_388;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_398,"Enemy stats table is bigger than in original game","");
    LandstalkerException::LandstalkerException(pLVar36,(string *)local_398);
    __cxa_throw(pLVar36,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException)
    ;
  }
  std::
  _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
  ::~_Rb_tree(&local_c0);
  std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_unsigned_char>,_std::_Select1st<std::pair<const_unsigned_short,_unsigned_char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree(&local_120);
  if (local_178._M_current != (EnemyType **)0x0) {
    operator_delete(local_178._M_current,local_168 - (long)local_178._M_current);
  }
  local_2f8._0_8_ = (ColorPalette<6UL> *)0x0;
  local_308._0_8_ = (ColorPalette<6UL> *)0x0;
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
  local_278[0]._M_allocated_capacity = (_Base_ptr)0x0;
  local_288 = (undefined1  [8])0x0;
  uStack_280 = (ColorPalette<7UL> *)0x0;
  local_248 = (_Base_ptr)0x0;
  local_258 = (undefined1  [8])0x0;
  uStack_250 = (pointer)0x0;
  p_Var29 = (local_310->_entity_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((key_type)p_Var29 != local_220) {
    do {
      p_Var27 = p_Var29[1]._M_parent;
      lVar26 = 0x33;
      do {
        cVar60 = *(char *)((long)&p_Var27->_M_color + lVar26);
        if (cVar60 != '\0') break;
        bVar62 = lVar26 != 0x47;
        lVar26 = lVar26 + 4;
      } while (bVar62);
      if (cVar60 == '\0') {
        pMVar56 = (key_type)
                  (((long)stack0xfffffffffffffd00 - local_308._0_8_ >> 3) * -0x5555555555555555);
        pCVar34 = stack0xfffffffffffffd00;
        if (stack0xfffffffffffffd00 != (ColorPalette<6UL> *)local_308._0_8_) {
          lVar26 = 0;
          p_Var27 = (_Base_ptr)0x0;
          local_318 = pMVar56;
          do {
            uVar14 = local_308._0_8_;
            p_Var39 = p_Var29[1]._M_parent;
            lVar52 = 0;
            do {
              bVar62 = Color::operator==((Color *)(uVar14 + lVar52 + lVar26),
                                         (Color *)((long)&p_Var39[1]._M_left + lVar52));
              bVar63 = lVar52 != 0x14;
              lVar52 = lVar52 + 4;
            } while (bVar62 && bVar63);
            pCVar34 = (ColorPalette<6UL> *)local_308._0_8_;
            pMVar56 = (key_type)p_Var27;
            if (bVar62) break;
            p_Var27 = (_Base_ptr)
                      &((_Rb_tree_impl<std::less<EnemyType_*>,_true> *)&p_Var27->_M_color)->
                       field_0x1;
            lVar26 = lVar26 + 0x18;
            pMVar56 = local_318;
          } while (p_Var27 < (undefined1 *)
                             (((long)stack0xfffffffffffffd00 - local_308._0_8_ >> 3) *
                             -0x5555555555555555));
        }
        if (((ulong)pMVar56 & 0xff) ==
            ((long)stack0xfffffffffffffd00 - (long)pCVar34 >> 3) * -0x5555555555555555) {
          p_Var27 = p_Var29[1]._M_parent;
          if (stack0xfffffffffffffd00 == (ColorPalette<6UL> *)local_2f8._0_8_) {
            std::vector<ColorPalette<6ul>,std::allocator<ColorPalette<6ul>>>::
            _M_realloc_insert<ColorPalette<6ul>&>
                      ((vector<ColorPalette<6ul>,std::allocator<ColorPalette<6ul>>> *)local_308,
                       stack0xfffffffffffffd00,(ColorPalette<6UL> *)&p_Var27[1]._M_left);
          }
          else {
            _Var24 = p_Var27[2]._M_color;
            uVar16 = *(undefined4 *)&p_Var27[2].field_0x4;
            (unique0x10003dcb->super_array<Color,_6UL>)._M_elems[4]._r = (char)_Var24;
            (unique0x10003dcb->super_array<Color,_6UL>)._M_elems[4]._g = (char)(_Var24 >> 8);
            (unique0x10003dcb->super_array<Color,_6UL>)._M_elems[4]._b = (char)(_Var24 >> 0x10);
            (unique0x10003dcb->super_array<Color,_6UL>)._M_elems[4]._invalid =
                 (bool)(char)(_Var24 >> 0x18);
            (unique0x10003dcb->super_array<Color,_6UL>)._M_elems[5]._r = (char)uVar16;
            (unique0x10003dcb->super_array<Color,_6UL>)._M_elems[5]._g = (char)((uint)uVar16 >> 8);
            (unique0x10003dcb->super_array<Color,_6UL>)._M_elems[5]._b =
                 (char)((uint)uVar16 >> 0x10);
            (unique0x10003dcb->super_array<Color,_6UL>)._M_elems[5]._invalid =
                 (bool)(char)((uint)uVar16 >> 0x18);
            p_Var39 = p_Var27[1]._M_right;
            *(_Base_ptr *)(stack0xfffffffffffffd00->super_array<Color,_6UL>)._M_elems =
                 p_Var27[1]._M_left;
            *(_Base_ptr *)((stack0xfffffffffffffd00->super_array<Color,_6UL>)._M_elems + 2) =
                 p_Var39;
            unique0x00006b80 = stack0xfffffffffffffd00 + 1;
          }
        }
        local_398[0] = *(string *)&p_Var29[1]._M_color;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_258,local_398);
        local_398._0_8_ = CONCAT71(local_398._1_7_,(char)pMVar56) & 0xffffffffffffff7f;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_258,local_398);
        p_Var27 = p_Var29[1]._M_parent;
      }
      lVar26 = -0x18;
      do {
        cVar60 = *(char *)((long)&p_Var27[3]._M_color + lVar26 + 3);
        if (cVar60 != '\0') break;
        bVar62 = lVar26 != 0;
        lVar26 = lVar26 + 4;
      } while (bVar62);
      if (cVar60 == '\0') {
        pMVar56 = (key_type)(((long)uStack_280 - (long)local_288 >> 2) * 0x6db6db6db6db6db7);
        auVar35 = (undefined1  [8])uStack_280;
        if ((undefined1  [8])uStack_280 != local_288) {
          lVar26 = 0;
          p_Var27 = (_Base_ptr)0x0;
          local_318 = pMVar56;
          do {
            auVar35 = local_288;
            p_Var39 = p_Var29[1]._M_parent;
            lVar52 = 0;
            do {
              bVar62 = Color::operator==((Color *)((long)auVar35 + lVar52 + lVar26),
                                         (Color *)((long)&p_Var39[2]._M_parent + lVar52));
              bVar63 = lVar52 != 0x18;
              lVar52 = lVar52 + 4;
            } while (bVar62 && bVar63);
            auVar35 = local_288;
            pMVar56 = (key_type)p_Var27;
            if (bVar62) break;
            p_Var27 = (_Base_ptr)
                      &((_Rb_tree_impl<std::less<EnemyType_*>,_true> *)&p_Var27->_M_color)->
                       field_0x1;
            lVar26 = lVar26 + 0x1c;
            pMVar56 = local_318;
          } while (p_Var27 < (undefined1 *)
                             (((long)uStack_280 - (long)local_288 >> 2) * 0x6db6db6db6db6db7));
        }
        if (((ulong)pMVar56 & 0xff) == ((long)uStack_280 - (long)auVar35 >> 2) * 0x6db6db6db6db6db7)
        {
          p_Var27 = p_Var29[1]._M_parent;
          if (uStack_280 == (ColorPalette<7UL> *)local_278[0]._0_8_) {
            std::vector<ColorPalette<7ul>,std::allocator<ColorPalette<7ul>>>::
            _M_realloc_insert<ColorPalette<7ul>&>
                      ((vector<ColorPalette<7ul>,std::allocator<ColorPalette<7ul>>> *)local_288,
                       uStack_280,(ColorPalette<7UL> *)&p_Var27[2]._M_parent);
          }
          else {
            p_Var39 = p_Var27[2]._M_parent;
            p_Var10 = p_Var27[2]._M_left;
            uVar14 = *(undefined8 *)((long)&p_Var27[2]._M_right + 4);
            *(undefined8 *)((uStack_280->super_array<Color,_7UL>)._M_elems + 3) =
                 *(undefined8 *)((long)&p_Var27[2]._M_left + 4);
            *(undefined8 *)((uStack_280->super_array<Color,_7UL>)._M_elems + 5) = uVar14;
            *(_Base_ptr *)(uStack_280->super_array<Color,_7UL>)._M_elems = p_Var39;
            *(_Base_ptr *)((uStack_280->super_array<Color,_7UL>)._M_elems + 2) = p_Var10;
            uStack_280 = uStack_280 + 1;
          }
        }
        local_398[0] = *(string *)&p_Var29[1]._M_color;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_258,local_398);
        local_398._0_8_ = CONCAT71(local_398._1_7_,(char)pMVar56) | 0x80;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_258,local_398);
      }
      p_Var29 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var29);
    } while ((key_type)p_Var29 != local_220);
  }
  local_398[0] = (string)0xff;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_258,local_398);
  local_398[0] = (string)0xff;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_258,local_398);
  uVar31 = (long)uStack_250 - (long)local_258;
  if (0x2a6 < uVar31) {
    pLVar36 = (LandstalkerException *)__cxa_allocate_exception(0x28);
    local_398._0_8_ = local_388;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_398,
               "Entity palette uses table must not be bigger than the one from base game","");
    LandstalkerException::LandstalkerException(pLVar36,(string *)local_398);
    __cxa_throw(pLVar36,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException)
    ;
  }
  local_1e8 = (undefined1  [8])0x0;
  puStack_1e0 = (pointer)0x0;
  local_1d8 = (_Base_ptr)0x0;
  if ((undefined1  [8])uStack_250 == local_258) {
    puVar49 = (pointer)0x0;
    sVar59 = uVar31;
  }
  else {
    puVar49 = (pointer)operator_new(uVar31);
    sVar59 = (long)uStack_250 - (long)local_258;
  }
  local_1d8 = (_Base_ptr)(puVar49 + uVar31);
  local_1e8 = (undefined1  [8])puVar49;
  if ((undefined1  [8])uStack_250 != local_258) {
    puStack_1e0 = puVar49;
    memmove(puVar49,(void *)local_258,sVar59);
  }
  puStack_1e0 = puVar49 + sVar59;
  md::ROM::set_bytes(rom,0x1a453a,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e8
                    );
  if (local_1e8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1e8,(long)local_1d8 - (long)local_1e8);
  }
  pCVar34 = stack0xfffffffffffffd00;
  local_218 = (undefined1  [8])0x0;
  p_Stack_210 = (_Base_ptr)0x0;
  local_208 = (_Base_ptr)0x0;
  if ((ColorPalette<6UL> *)local_308._0_8_ == stack0xfffffffffffffd00) {
    p_Var27 = (_Base_ptr)0x0;
LAB_001b8cc6:
    local_1b8 = (undefined1  [8])0x0;
    sVar59 = 0;
    puVar49 = (pointer)0x0;
    local_1a8 = p_Var27;
  }
  else {
    this_00 = (ColorPalette<6UL> *)local_308._0_8_;
    do {
      ColorPalette<6UL>::to_bytes((ByteArray *)local_398,this_00);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_218,p_Stack_210,
                 local_398._0_8_,local_398._8_8_);
      if ((pointer)local_398._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_398._0_8_,local_388._0_8_ - local_398._0_8_);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pCVar34);
    p_Var27 = (_Base_ptr)((long)p_Stack_210 - (long)local_218);
    if ((_Base_ptr)0x3c0 < p_Var27) {
      pLVar36 = (LandstalkerException *)__cxa_allocate_exception(0x28);
      local_398._0_8_ = local_388;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_398,
                 "Entity low palettes table must not be bigger than the one from base game","");
      LandstalkerException::LandstalkerException(pLVar36,(string *)local_398);
      __cxa_throw(pLVar36,&LandstalkerException::typeinfo,
                  LandstalkerException::~LandstalkerException);
    }
    local_1b8 = (undefined1  [8])0x0;
    puStack_1b0 = (pointer)0x0;
    local_1a8 = (_Base_ptr)0x0;
    if ((undefined1  [8])p_Stack_210 == local_218) goto LAB_001b8cc6;
    puVar49 = (pointer)operator_new((ulong)p_Var27);
    local_1a8 = (_Base_ptr)(puVar49 + (long)&p_Var27->_M_color);
    sVar59 = (long)p_Stack_210 - (long)local_218;
    local_1b8 = (undefined1  [8])puVar49;
    if (sVar59 != 0) {
      puStack_1b0 = puVar49;
      memmove(puVar49,(void *)local_218,sVar59);
    }
  }
  puStack_1b0 = puVar49 + sVar59;
  md::ROM::set_bytes(rom,0x1a47e0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8
                    );
  if (local_1b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1b8,(long)local_1a8 - (long)local_1b8);
  }
  pMVar56 = (key_type)uStack_280;
  local_158 = (undefined1  [8])0x0;
  pvStack_150 = (void *)0x0;
  local_148 = (_Base_ptr)0x0;
  if (local_288 == (undefined1  [8])uStack_280) {
    pcVar44 = (pointer)0x0;
  }
  else {
    auVar35 = local_288;
    do {
      ColorPalette<7UL>::to_bytes((ByteArray *)local_398,(ColorPalette<7UL> *)auVar35);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_158,pvStack_150,
                 local_398._0_8_,local_398._8_8_);
      if ((pointer)local_398._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_398._0_8_,local_388._0_8_ - local_398._0_8_);
      }
      auVar35 = (undefined1  [8])
                ((long)&(((key_type)auVar35)->_foreground_tiles).
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 4);
    } while (auVar35 != (undefined1  [8])pMVar56);
    pcVar44 = (pointer)((long)pvStack_150 - (long)local_158);
    if ((pointer)0xee < pcVar44) {
      pLVar36 = (LandstalkerException *)__cxa_allocate_exception(0x28);
      local_398._0_8_ = local_388;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_398,
                 "Entity high palettes table must not be bigger than the one from base game","");
      LandstalkerException::LandstalkerException(pLVar36,(string *)local_398);
      __cxa_throw(pLVar36,&LandstalkerException::typeinfo,
                  LandstalkerException::~LandstalkerException);
    }
    local_398._0_8_ = (pointer)0x0;
    local_398._8_8_ = (pointer)0x0;
    local_388._0_8_ = 0;
    if ((undefined1  [8])pvStack_150 != local_158) {
      puVar49 = (pointer)operator_new((ulong)pcVar44);
      local_388._0_8_ = pcVar44 + (long)puVar49;
      sVar59 = (long)pvStack_150 - (long)local_158;
      local_398._0_8_ = puVar49;
      if (sVar59 != 0) {
        local_398._8_8_ = puVar49;
        memmove(puVar49,(void *)local_158,sVar59);
      }
      goto LAB_001b8e23;
    }
  }
  local_398._0_8_ = (pointer)0x0;
  sVar59 = 0;
  puVar49 = (pointer)0x0;
  local_388._0_8_ = pcVar44;
LAB_001b8e23:
  local_398._8_8_ = puVar49 + sVar59;
  md::ROM::set_bytes(rom,0x1a4ba0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_398
                    );
  if ((pointer)local_398._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_398._0_8_,local_388._0_8_ - local_398._0_8_);
  }
  if (local_158 != (undefined1  [8])0x0) {
    operator_delete((void *)local_158,(long)local_148 - (long)local_158);
  }
  if (local_218 != (undefined1  [8])0x0) {
    operator_delete((void *)local_218,(long)local_208 - (long)local_218);
  }
  if (local_258 != (undefined1  [8])0x0) {
    operator_delete((void *)local_258,(long)local_248 - (long)local_258);
  }
  if (local_288 != (undefined1  [8])0x0) {
    operator_delete((void *)local_288,local_278[0]._M_allocated_capacity - (long)local_288);
  }
  if ((ColorPalette<6UL> *)local_308._0_8_ != (ColorPalette<6UL> *)0x0) {
    operator_delete((void *)local_308._0_8_,local_2f8._0_8_ - local_308._0_8_);
  }
  strings = &local_310->_game_strings;
  build_trees_from_strings
            ((vector<HuffmanTree_*,_std::allocator<HuffmanTree_*>_> *)local_258,strings);
  encode_huffman_trees
            ((ByteArray *)local_1e8,
             (vector<HuffmanTree_*,_std::allocator<HuffmanTree_*>_> *)local_258);
  uVar31 = (long)puStack_1e0 - (long)local_1e8;
  if (0x93c < uVar31) {
    pLVar36 = (LandstalkerException *)__cxa_allocate_exception(0x28);
    std::__cxx11::to_string
              ((string *)local_288,(unsigned_long)(puStack_1e0 + (-0x93c - (long)local_1e8)));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
                   "New Huffman trees data size is ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288);
    pbVar37 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
                     " bytes bigger than the original size");
    local_398._0_8_ = (pbVar37->_M_dataplus)._M_p;
    paVar40 = &pbVar37->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._0_8_ == paVar40) {
      local_388._0_8_ = paVar40->_M_allocated_capacity;
      local_388._8_8_ = *(long *)((long)&pbVar37->field_2 + 8);
      local_398._0_8_ = local_388;
    }
    else {
      local_388._0_8_ = paVar40->_M_allocated_capacity;
    }
    local_398._8_8_ = pbVar37->_M_string_length;
    (pbVar37->_M_dataplus)._M_p = (pointer)paVar40;
    pbVar37->_M_string_length = 0;
    (pbVar37->field_2)._M_local_buf[0] = '\0';
    LandstalkerException::LandstalkerException(pLVar36,(string *)local_398);
    __cxa_throw(pLVar36,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException)
    ;
  }
  local_308._0_8_ = (pointer)0x0;
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
  local_2f8._0_8_ = (pointer)0x0;
  if ((undefined1  [8])puStack_1e0 == local_1e8) {
    puVar49 = (pointer)0x0;
    sVar59 = uVar31;
  }
  else {
    puVar49 = (pointer)operator_new(uVar31);
    sVar59 = (long)puStack_1e0 - (long)local_1e8;
  }
  local_2f8._0_8_ = puVar49 + uVar31;
  local_308._0_8_ = puVar49;
  if ((undefined1  [8])puStack_1e0 != local_1e8) {
    unique0x1000426f = (ColorPalette<6UL> *)puVar49;
    memmove(puVar49,(void *)local_1e8,sVar59);
  }
  register0x000000b8 = (ColorPalette<6UL> *)(puVar49 + sVar59);
  md::ROM::set_bytes(rom,0x23d60,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_308)
  ;
  if ((pointer)local_308._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_308._0_8_,local_2f8._0_8_ - local_308._0_8_);
  }
  md::ROM::mark_empty_chunk(rom,0x2b27a,0x38600);
  encode_textbanks((vector<ByteArray,_std::allocator<ByteArray>_> *)local_288,strings,
                   (vector<HuffmanTree_*,_std::allocator<HuffmanTree_*>_> *)local_258);
  pMVar56 = (key_type)uStack_280;
  local_218 = (undefined1  [8])0x0;
  p_Stack_210 = (_Base_ptr)0x0;
  local_208 = (_Base_ptr)0x0;
  if (local_288 != (undefined1  [8])uStack_280) {
    auVar35 = local_288;
    do {
      local_398._8_8_ = (pointer)0x0;
      local_388._0_8_ = local_388._0_8_ & 0xffffffffffffff00;
      local_398._0_8_ = local_388;
      uVar22 = md::ROM::inject_bytes
                         (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)auVar35,
                          (string *)local_398);
      if ((undefined1 *)local_398._0_8_ != local_388) {
        operator_delete((void *)local_398._0_8_,(ulong)(local_388._0_8_ + 1));
      }
      ByteArray::add_long((ByteArray *)local_218,uVar22);
      auVar35 = (undefined1  [8])
                &(((key_type)auVar35)->_foreground_tiles).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    } while (auVar35 != (undefined1  [8])pMVar56);
  }
  ByteArray::add_long((ByteArray *)local_218,0xffffffff);
  local_398._8_8_ = (pointer)0x0;
  local_388._0_8_ = local_388._0_8_ & 0xffffffffffffff00;
  local_398._0_8_ = local_388;
  uVar22 = md::ROM::inject_bytes
                     (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218,
                      (string *)local_398);
  if ((undefined1 *)local_398._0_8_ != local_388) {
    operator_delete((void *)local_398._0_8_,local_388._0_8_ + 1);
  }
  md::ROM::set_long(rom,0x22e80,uVar22);
  ppHVar17 = uStack_250;
  for (auVar35 = local_258; auVar35 != (undefined1  [8])ppHVar17;
      auVar35 = (undefined1  [8])((long)auVar35 + 8)) {
    this = *(HuffmanTree **)auVar35;
    if (this != (HuffmanTree *)0x0) {
      HuffmanTree::~HuffmanTree(this);
    }
    operator_delete(this,0x38);
  }
  if (local_218 != (undefined1  [8])0x0) {
    operator_delete((void *)local_218,(long)local_208 - (long)local_218);
  }
  std::vector<ByteArray,_std::allocator<ByteArray>_>::~vector
            ((vector<ByteArray,_std::allocator<ByteArray>_> *)local_288);
  if (local_1e8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1e8,(long)local_1d8 - (long)local_1e8);
  }
  if (local_258 != (undefined1  [8])0x0) {
    operator_delete((void *)local_258,(long)local_248 - (long)local_258);
  }
  pMVar57 = (local_310->_map_connections).
            super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
            super__Vector_impl_data._M_start;
  pMVar12 = (local_310->_map_connections).
            super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_308._0_8_ = (pointer)0x0;
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
  local_2f8._0_8_ = (pointer)0x0;
  if (pMVar57 != pMVar12) {
    do {
      uVar2 = pMVar57->_pos_x_1;
      uVar4 = pMVar57->_pos_y_1;
      local_288[3] = uVar4;
      local_288[2] = uVar2;
      uVar3 = pMVar57->_pos_x_2;
      uVar5 = pMVar57->_pos_y_2;
      local_288[7] = uVar5;
      local_288[6] = uVar3;
      local_288[1] = (char)pMVar57->_map_id_1;
      local_288[0] = pMVar57->_extra_byte_1 << 2 | (byte)(pMVar57->_map_id_1 >> 8) & 3;
      local_288[4] = pMVar57->_extra_byte_2 << 2 | (byte)(pMVar57->_map_id_2 >> 8) & 3;
      local_288[5] = (char)pMVar57->_map_id_2;
      __l._M_len = 8;
      __l._M_array = local_288;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_398,__l,
                 (allocator_type *)local_258);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_308,
                 stack0xfffffffffffffd00,local_398._0_8_,local_398._8_8_);
      if ((pointer)local_398._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_398._0_8_,local_388._0_8_ - local_398._0_8_);
      }
      pMVar57 = pMVar57 + 1;
    } while (pMVar57 != pMVar12);
  }
  local_398[0] = (string)0xff;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_308,local_398);
  local_398[0] = (string)0xff;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_308,local_398);
  md::ROM::mark_empty_chunk(rom,0x11cea2,0x11ea64);
  local_398._8_8_ = (pointer)0x0;
  local_388._0_8_ = local_388._0_8_ & 0xffffffffffffff00;
  local_398._0_8_ = local_388;
  uVar22 = md::ROM::inject_bytes
                     (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_308,
                      (string *)local_398);
  if ((undefined1 *)local_398._0_8_ != local_388) {
    operator_delete((void *)local_398._0_8_,local_388._0_8_ + 1);
  }
  md::ROM::set_long(rom,0xa0a08,uVar22);
  if ((pointer)local_308._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_308._0_8_,local_2f8._0_8_ - local_308._0_8_);
  }
  ppCVar53 = (local_310->_map_palettes).
             super__Vector_base<ColorPalette<13UL>_*,_std::allocator<ColorPalette<13UL>_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  local_220 = (key_type)
              (local_310->_map_palettes).
              super__Vector_base<ColorPalette<13UL>_*,_std::allocator<ColorPalette<13UL>_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_308._0_8_ = (pointer)0x0;
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
  local_2f8._0_8_ = (pointer)0x0;
  if ((key_type)ppCVar53 != local_220) {
    do {
      pCVar13 = *ppCVar53;
      lVar26 = 0;
      do {
        uVar21 = Color::to_bgr_word((Color *)(&(pCVar13->super_array<Color,_13UL>)._M_elems[0]._r +
                                             lVar26));
        local_398[0] = SUB21(uVar21 >> 8,0);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_308,local_398);
        local_398[0] = (string)(char)uVar21;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_308,local_398);
        lVar26 = lVar26 + 4;
      } while (lVar26 != 0x34);
      ppCVar53 = ppCVar53 + 1;
    } while ((key_type)ppCVar53 != local_220);
  }
  md::ROM::mark_empty_chunk(rom,0x11c926,0x11cea2);
  local_398._8_8_ = (pointer)0x0;
  local_388._0_8_ = local_388._0_8_ & 0xffffffffffffff00;
  local_398._0_8_ = local_388;
  uVar22 = md::ROM::inject_bytes
                     (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_308,
                      (string *)local_398);
  if ((undefined1 *)local_398._0_8_ != local_388) {
    operator_delete((void *)local_398._0_8_,local_388._0_8_ + 1);
  }
  md::ROM::set_long(rom,0xa0a04,uVar22);
  if ((pointer)local_308._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_308._0_8_,local_2f8._0_8_ - local_308._0_8_);
  }
  write_maps(local_310,rom,
             (map<MapLayout_*,_unsigned_int,_std::less<MapLayout_*>,_std::allocator<std::pair<MapLayout_*const,_unsigned_int>_>_>
              *)&local_f0);
  std::
  _Rb_tree<MapLayout_*,_std::pair<MapLayout_*const,_unsigned_int>,_std::_Select1st<std::pair<MapLayout_*const,_unsigned_int>_>,_std::less<MapLayout_*>,_std::allocator<std::pair<MapLayout_*const,_unsigned_int>_>_>
  ::~_Rb_tree(&local_f0);
  return;
}

Assistant:

void io::write_world_to_rom(World& world, md::ROM& rom)
{
    world.clean_unused_map_palettes();
    world.clean_unused_blocksets();
    world.clean_unused_layouts();

    std::map<MapLayout*, uint32_t> map_layout_addresses = write_map_layouts(world, rom);
    write_blocksets(world, rom);
    write_item_names(world, rom);
    write_items(world, rom);
    write_chest_contents(world, rom);
    write_entity_types(world, rom);
    write_entity_type_palettes(world, rom);
    write_game_strings(world, rom);
    write_map_connections(world, rom);
    write_map_palettes(world, rom);
    write_maps(world, rom, map_layout_addresses);
}